

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>,true>
          (Thread *this)

{
  Simd<int,_(unsigned_char)__x04_> value;
  int iVar1;
  short *psVar2;
  int *piVar3;
  byte local_31;
  undefined1 auStack_30 [7];
  u8 i;
  Simd<int,_(unsigned_char)__x04_> result;
  Simd<short,_(unsigned_char)__b_> val;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  for (local_31 = 0; local_31 < 4; local_31 = local_31 + 1) {
    psVar2 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)(result.v + 2),local_31);
    iVar1 = Convert<int,short>(*psVar2);
    piVar3 = Simd<int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<int,_(unsigned_char)__x04_> *)auStack_30,local_31);
    *piVar3 = iVar1;
  }
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = auStack_30._0_4_;
  value.v[1] = stack0xffffffffffffffd4;
  Push<wabt::interp::Simd<int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}